

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::matchNextAux
          (GenMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Term *this_00;
  socklen_t in_ECX;
  sockaddr *in_RSI;
  GenMatcher *in_RDI;
  Binder *in_stack_00000018;
  uint boundVar;
  Term *in_stack_00000020;
  Binder binder_1;
  uint var;
  Binder binder;
  Term *nt;
  bool success;
  bool local_69;
  Binder local_50;
  uint local_3c;
  Binder local_38;
  Term *local_28;
  bool local_1a;
  byte local_19;
  TermList local_10;
  TermList local_8;
  
  local_19 = (byte)in_ECX & 1;
  local_8._content = (uint64_t)in_RSI;
  bVar1 = Kernel::TermList::isTerm((TermList *)0x3cdedf);
  if (bVar1) {
    local_28 = Kernel::TermList::term((TermList *)0x3cdef2);
    bVar1 = Kernel::Term::shared((Term *)0x3cdf01);
    if ((bVar1) && (bVar1 = Kernel::Term::ground((Term *)0x3cdf11), bVar1)) {
      local_1a = Kernel::TermList::operator==(&local_10,&local_8);
    }
    else {
      Binder::Binder(&local_38,in_RDI);
      bVar1 = Kernel::TermList::isTerm((TermList *)0x3cdf4a);
      local_69 = false;
      if (bVar1) {
        this_00 = Kernel::TermList::term((TermList *)0x3cdf63);
        uVar4 = Kernel::Term::functor(this_00);
        uVar2 = Kernel::Term::functor(local_28);
        local_69 = false;
        if (uVar4 == uVar2) {
          Kernel::TermList::term((TermList *)0x3cdf9c);
          local_69 = Kernel::MatchingUtils::
                     matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                               ((Term *)binder_1._parent,in_stack_00000020,in_stack_00000018);
        }
      }
      local_1a = local_69;
    }
  }
  else {
    local_3c = Kernel::TermList::var(&local_10);
    Binder::Binder(&local_50,in_RDI);
    iVar3 = Binder::bind(&local_50,local_3c,(sockaddr *)local_8._content,in_ECX);
    local_1a = (bool)((byte)iVar3 & 1);
  }
  if ((local_1a == false) && ((local_19 & 1) != 0)) {
    while (uVar4 = Lib::Stack<unsigned_int>::pop(&in_RDI->_boundVars), uVar4 != 0xffffffff) {
      Lib::ArrayMap<Kernel::TermList>::remove(&in_RDI->_bindings,(char *)(ulong)uVar4);
    }
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool SubstitutionTree<LeafData_>::GenMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  bool success;
  if(nodeTerm.isTerm()) {
    Term* nt=nodeTerm.term();
    if(nt->shared() && nt->ground()) {
      //ground terms match only iff they're equal
      success = nodeTerm==queryTerm;
    } else {
      Binder binder(this);
      ASS(nt->arity()>0);

      success = queryTerm.isTerm() && queryTerm.term()->functor()==nt->functor() &&
	MatchingUtils::matchArgs(nt, queryTerm.term(), binder);
    }
  } else {
    ASS_METHOD(nodeTerm,isOrdinaryVar());
    unsigned var=nodeTerm.var();
    Binder binder(this);
    success=binder.bind(var,queryTerm);
  }

  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind ordinary variables, that were bound.
      for(;;) {
	unsigned boundVar = _boundVars.pop();
	if(boundVar==BACKTRACK_SEPARATOR) {
	  break;
	}
	_bindings.remove(boundVar);
      }
    }
  }

  return success;
}